

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

void __thiscall doublechecked::Roaring::removeRangeClosed(Roaring *this,uint32_t min,uint32_t max)

{
  iterator __first;
  iterator __last;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  uint32_t local_20;
  uint32_t local_1c;
  
  local_20 = max;
  local_1c = min;
  roaring::Roaring::removeRangeClosed(&this->plain,min,max);
  if (min <= max) {
    this_00 = &this->check;
    __first = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::lower_bound(&this_00->_M_t,&local_1c);
    __last = std::
             _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             ::upper_bound(&this_00->_M_t,&local_20);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux(&this_00->_M_t,(const_iterator)__first._M_node,(const_iterator)__last._M_node);
  }
  return;
}

Assistant:

void removeRangeClosed(uint32_t min, uint32_t max) {
        plain.removeRangeClosed(min, max);
        if (min <= max) {
            check.erase(check.lower_bound(min), check.upper_bound(max));
        }
    }